

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O1

int XSUM_usage_advanced(char *exename)

{
  int iVar1;
  
  XSUM_usage(exename);
  XSUM_log("Advanced :\n");
  XSUM_log("  -V, --version        Display version information \n");
  XSUM_log("      --tag            Produce BSD-style checksum lines \n");
  XSUM_log(
          "      --little-endian  Checksum values use little endian convention (default: big endian) \n"
          );
  XSUM_log("  -b                   Run benchmark \n");
  XSUM_log("  -b#                  Bench only algorithm variant # \n");
  XSUM_log("  -i#                  Number of times to run the benchmark (default: %u) \n",
           (ulong)g_nbIterations);
  XSUM_log("  -q, --quiet          Don\'t display version header in benchmark mode \n");
  XSUM_log("\n");
  XSUM_log("The following four options are useful only when verifying checksums (-c): \n");
  XSUM_log("  -q, --quiet          Don\'t print OK for each successfully verified file \n");
  XSUM_log("      --status         Don\'t output anything, status code shows success \n");
  XSUM_log("      --strict         Exit non-zero for improperly formatted checksum lines \n");
  iVar1 = XSUM_log("      --warn           Warn about improperly formatted checksum lines \n");
  return iVar1;
}

Assistant:

static int XSUM_usage_advanced(const char* exename)
{
    XSUM_usage(exename);
    XSUM_log( "Advanced :\n");
    XSUM_log( "  -V, --version        Display version information \n");
    XSUM_log( "      --tag            Produce BSD-style checksum lines \n");
    XSUM_log( "      --little-endian  Checksum values use little endian convention (default: big endian) \n");
    XSUM_log( "  -b                   Run benchmark \n");
    XSUM_log( "  -b#                  Bench only algorithm variant # \n");
    XSUM_log( "  -i#                  Number of times to run the benchmark (default: %u) \n", (unsigned)g_nbIterations);
    XSUM_log( "  -q, --quiet          Don't display version header in benchmark mode \n");
    XSUM_log( "\n");
    XSUM_log( "The following four options are useful only when verifying checksums (-c): \n");
    XSUM_log( "  -q, --quiet          Don't print OK for each successfully verified file \n");
    XSUM_log( "      --status         Don't output anything, status code shows success \n");
    XSUM_log( "      --strict         Exit non-zero for improperly formatted checksum lines \n");
    XSUM_log( "      --warn           Warn about improperly formatted checksum lines \n");
    return 0;
}